

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O1

void lsvm::hashset::put(hashset *h,void *val)

{
  uint uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  uint uVar5;
  hash keyhash;
  uint uVar6;
  ulong uVar7;
  equals_fp p_Var8;
  equals_fp p_Var9;
  equals_fp p_Var10;
  uint uVar11;
  uint16_t local_38;
  
  keyhash = (*h->hash)(val);
  uVar4 = (uint)h->bits & (uint)keyhash;
  p_Var9 = (&h[1].equals)[uVar4];
LAB_0010521b:
  if (p_Var9 == (equals_fp)0x0) {
    local_38 = (uint16_t)uVar4;
    insert_into_partition(h,keyhash,local_38,val,true);
    return;
  }
  uVar1 = (&primes)[*(uint *)(p_Var9 + 0xc)];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = keyhash;
  uVar7 = SUB168(auVar2 % ZEXT416(uVar1),0);
  p_Var10 = p_Var9 + (uVar7 * 2 + 2) * 8;
  uVar5 = uVar1 - 1;
  uVar6 = (h->range * uVar1) / 100000;
  if (uVar1 <= uVar6) {
    uVar6 = uVar5;
  }
  uVar11 = uVar6 + SUB164(auVar2 % ZEXT416(uVar1),0);
  if (uVar11 < uVar1) {
    p_Var8 = p_Var10 + (ulong)uVar6 * 0x10;
    do {
      if (((*(hash *)p_Var10 == keyhash) && (*(void **)(p_Var10 + 8) != (void *)0x0)) &&
         (bVar3 = (*h->equals)(val,*(void **)(p_Var10 + 8)), bVar3)) goto LAB_0010532e;
      p_Var10 = p_Var10 + 0x10;
    } while (p_Var10 <= p_Var8);
  }
  else {
    p_Var8 = p_Var9 + 0x10;
    if (uVar7 <= uVar5) {
      do {
        if (((*(hash *)p_Var10 == keyhash) && (*(void **)(p_Var10 + 8) != (void *)0x0)) &&
           (bVar3 = (*h->equals)(val,*(void **)(p_Var10 + 8)), bVar3)) goto LAB_0010532e;
        p_Var10 = p_Var10 + 0x10;
      } while (p_Var10 <= p_Var8 + (ulong)uVar5 * 0x10);
    }
    do {
      if (((*(hash *)p_Var8 == keyhash) && (*(void **)(p_Var8 + 8) != (void *)0x0)) &&
         (bVar3 = (*h->equals)(val,*(void **)(p_Var8 + 8)), bVar3)) {
        *(void **)(p_Var8 + 8) = val;
        goto LAB_00105333;
      }
      p_Var8 = p_Var8 + 0x10;
    } while (p_Var8 <= p_Var9 + ((ulong)(uVar11 - uVar1) * 2 + 2) * 8);
  }
  p_Var9 = *(equals_fp *)p_Var9;
  bVar3 = true;
  goto LAB_00105339;
LAB_0010532e:
  *(void **)(p_Var10 + 8) = val;
LAB_00105333:
  bVar3 = false;
LAB_00105339:
  if (!bVar3) {
    return;
  }
  goto LAB_0010521b;
}

Assistant:

void put(hashset* h, void* val){
    // calculate hash for a key
    hash keyhash = h->hash(val);
    // calculate bit for a hash
    uint16_t bit = hashbit(keyhash,h->bits);
    // get bit partition bucket
    hashbucket* bp = *partition(h,bit);

    // find key in a bucket using open address and replace it's value
    while(bp != null){
        uint32_t range = entry_range(h,bp);
        uint32_t index = entry_index(bp,keyhash);
        entry* he = get_entry(bp,index);
        const uint32_t bs = bucket_size(bp);
        if(range >= bs) range = bs-1;
        if((index+range) >= bs){
            entry* ehe = get_entry(bp,bs-1);
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
            range = (index+range) - bs;
            he = get_entry(bp,0);
            ehe = he+range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
        }else{
            entry* ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
        }
        bp = bp->next;    
    }

    // if key not found insert it into partition
    insert_into_partition(h,keyhash,bit,val,true);
}